

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::TextReader<fmt::Locale>::ReadTillEndOfLine(TextReader<fmt::Locale> *this)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  ArgList local_10;
  
  pcVar2 = (this->super_ReaderBase).ptr_;
  iVar3 = this->line_;
  do {
    cVar1 = *pcVar2;
    if (cVar1 == '\0') {
      iVar4 = 3;
    }
    else {
      pcVar2 = pcVar2 + 1;
      (this->super_ReaderBase).ptr_ = pcVar2;
      iVar4 = 0;
      if (cVar1 == '\n') {
        this->line_start_ = pcVar2;
        iVar3 = iVar3 + 1;
        this->line_ = iVar3;
        iVar4 = 1;
      }
    }
  } while (iVar4 == 0);
  if (iVar4 != 1) {
    local_10.types_ = 0;
    DoReportError(this,(this->super_ReaderBase).ptr_,(CStringRef)0x4b86ff,&local_10);
  }
  return;
}

Assistant:

void ReadTillEndOfLine() {
    while (char c = *ptr_) {
      ++ptr_;
      if (c == '\n') {
        line_start_ = ptr_;
        ++line_;
        return;
      }
    }
    DoReportError(ptr_, "expected newline");
  }